

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::Quantity<int,kj::(anonymous_namespace)::MiB>&>
          (String *__return_storage_ptr__,kj *this,
          Quantity<int,_kj::(anonymous_namespace)::MiB> *params)

{
  kj *this_00;
  Quantity<int,_kj::(anonymous_namespace)::MiB> *value;
  String local_30;
  kj *local_18;
  Quantity<int,_kj::(anonymous_namespace)::MiB> *params_local;
  
  local_18 = this;
  params_local = (Quantity<int,_kj::(anonymous_namespace)::MiB> *)__return_storage_ptr__;
  this_00 = (kj *)fwd<kj::Quantity<int,kj::(anonymous_namespace)::MiB>&>
                            ((Quantity<int,_kj::(anonymous_namespace)::MiB> *)this);
  toCharSequence<kj::Quantity<int,kj::(anonymous_namespace)::MiB>&>(&local_30,this_00,value);
  _::concat(__return_storage_ptr__,&local_30);
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}